

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPostIdxImm8s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  ulong uVar2;
  char *pcVar3;
  uint Imm;
  MCOperand *MO;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar2 = MCOperand_getImm(op);
  uVar1 = (uint)uVar2;
  if ((uVar1 & 0xff) << 2 < 10) {
    pcVar3 = "-";
    if ((uVar2 & 0x100) != 0) {
      pcVar3 = anon_var_dwarf_8bc56 + 0x11;
    }
    SStream_concat(O,"#%s%u",pcVar3,(ulong)((uVar1 & 0xff) << 2));
  }
  else {
    pcVar3 = "-";
    if ((uVar2 & 0x100) != 0) {
      pcVar3 = anon_var_dwarf_8bc56 + 0x11;
    }
    SStream_concat(O,"#%s0x%x",pcVar3,(ulong)((uVar1 & 0xff) << 2));
  }
  return;
}

Assistant:

static void printPostIdxImm8s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	unsigned Imm = (unsigned int)MCOperand_getImm(MO);
	if (((Imm & 0xff) << 2) > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	else
		SStream_concat(O, "#%s%u", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
}